

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

PatternClip * __thiscall PatternModel::clip(PatternClip *__return_storage_ptr__,PatternModel *this)

{
  int iVar1;
  ulong uVar2;
  SelectType SVar3;
  PatternSelection *this_00;
  PatternAnchor anchor;
  PatternSelection local_58;
  PatternSelection local_38;
  
  PatternClip::PatternClip(__return_storage_ptr__);
  if (this->mHasSelection == true) {
    this_00 = &local_58;
    local_58.mEnd.super_PatternCursorBase.column =
         (this->mSelection).mEnd.super_PatternCursorBase.column;
    local_58.mEnd.super_PatternCursorBase.track =
         (this->mSelection).mEnd.super_PatternCursorBase.track;
    local_58.mStart.super_PatternCursorBase.row =
         (this->mSelection).mStart.super_PatternCursorBase.row;
    local_58.mStart.super_PatternCursorBase.column =
         (this->mSelection).mStart.super_PatternCursorBase.column;
    local_58._8_8_ = *(undefined8 *)&(this->mSelection).mStart.super_PatternCursorBase.track;
  }
  else {
    uVar2._0_4_ = (this->mCursor).super_PatternCursorBase.row;
    uVar2._4_4_ = (this->mCursor).super_PatternCursorBase.column;
    iVar1 = (this->mCursor).super_PatternCursorBase.track;
    SVar3 = PatternAnchor::selectColumn(uVar2._4_4_);
    anchor.super_PatternCursorBase._0_8_ = uVar2 & 0xffffffff | (ulong)SVar3 << 0x20;
    this_00 = &local_38;
    anchor.super_PatternCursorBase.track = iVar1;
    PatternSelection::PatternSelection(this_00,anchor);
  }
  PatternClip::save(__return_storage_ptr__,&this->mPatternCurr,*this_00);
  return __return_storage_ptr__;
}

Assistant:

PatternClip PatternModel::clip() {
    PatternClip clip;
    
    if (mHasSelection) {
        clip.save(mPatternCurr, mSelection);
    } else {
        clip.save(mPatternCurr, PatternSelection(mCursor));
    }

    return clip;
}